

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O2

void __thiscall miniros::MasterLink::update(MasterLink *this,string *key,RpcValue *v)

{
  iterator iVar1;
  mapped_type *this_00;
  mutex *__mutex;
  allocator<char> local_99;
  string clean_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->internal_ != (Internal *)0x0) {
    names::clean(&clean_key,key);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (update::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"miniros.master_link",&local_99);
      std::operator+(&local_58,&local_78,".");
      std::operator+(&local_38,&local_58,"cached_parameters");
      console::initializeLogLocation(&update::loc,&local_38,Debug);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
    if (update::loc.level_ != Debug) {
      console::setLogLocationLevel(&update::loc,Debug);
      console::checkLogLocationEnabled(&update::loc);
    }
    if (update::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,update::loc.logger_,update::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                     ,0x3cb,
                     "void miniros::MasterLink::update(const std::string &, const RpcValue &)",
                     "Received parameter update for key [%s]",clean_key._M_dataplus._M_p);
    }
    __mutex = &this->internal_->params_mutex;
    std::mutex::lock(__mutex);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->internal_->subscribed_params)._M_t,&clean_key);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(this->internal_->subscribed_params)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                ::operator[](&this->internal_->params,&clean_key);
      XmlRpc::XmlRpcValue::operator=(this_00,v);
    }
    invalidateParentParams(this,&clean_key);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::__cxx11::string::~string((string *)&clean_key);
  }
  return;
}

Assistant:

void MasterLink::update(const std::string& key, const RpcValue& v)
{
  if (!internal_)
    return;
  std::string clean_key = names::clean(key);
  MINIROS_DEBUG_NAMED("cached_parameters", "Received parameter update for key [%s]", clean_key.c_str());

  std::scoped_lock<std::mutex> lock(internal_->params_mutex);

  if (internal_->subscribed_params.find(clean_key) != internal_->subscribed_params.end()) {
    internal_->params[clean_key] = v;
  }
  invalidateParentParams(clean_key);
}